

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O1

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::add_fertility_params
          (AttentionalModel<dynet::LSTMBuilder> *this,Model *model,uint hidden_dim,
          bool _rnn_src_embeddings)

{
  long lVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  uint v;
  undefined1 auVar3 [16];
  uint local_5c [9];
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000009,_rnn_src_embeddings) == 0) {
    local_5c[0] = hidden_dim;
    local_5c[1] = hidden_dim;
    local_38 = 0x100000000;
    lVar1 = 0;
    do {
      uVar2 = local_38 & 0xffffffff;
      local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
      local_5c[uVar2 + 2] = *(uint *)((long)local_5c + lVar1);
      lVar1 = lVar1 + 4;
    } while (lVar1 != 8);
  }
  else {
    local_5c[0] = hidden_dim;
    local_5c[1] = hidden_dim * 2;
    local_38 = 0x100000000;
    lVar1 = 0;
    do {
      uVar2 = local_38 & 0xffffffff;
      local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
      local_5c[uVar2 + 2] = *(uint *)((long)local_5c + lVar1);
      lVar1 = lVar1 + 4;
    } while (lVar1 != 8);
  }
  local_5c[0] = hidden_dim;
  auVar3 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wfhid = (Parameter)auVar3[0];
  *(long *)&this->field_0xc9 = auVar3._1_8_;
  *(int7 *)&this->field_0xd1 = auVar3._9_7_;
  local_38 = 0x100000001;
  local_5c[2] = hidden_dim;
  auVar3 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bfhid = (Parameter)auVar3[0];
  *(long *)&this->field_0xf9 = auVar3._1_8_;
  *(int7 *)&this->field_0x101 = auVar3._9_7_;
  local_38 = 0x100000001;
  local_5c[2] = hidden_dim;
  auVar3 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wfmu = (Parameter)auVar3[0];
  *(long *)&this->field_0xd9 = auVar3._1_8_;
  *(int7 *)&this->field_0xe1 = auVar3._9_7_;
  local_38 = 0x100000001;
  local_5c[2] = 1;
  auVar3 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bfmu = (Parameter)auVar3[0];
  *(long *)&this->field_0x109 = auVar3._1_8_;
  *(int7 *)&this->field_0x111 = auVar3._9_7_;
  local_38 = 0x100000001;
  local_5c[2] = hidden_dim;
  auVar3 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wfvar = (Parameter)auVar3[0];
  *(long *)&this->field_0xe9 = auVar3._1_8_;
  *(int7 *)&this->field_0xf1 = auVar3._9_7_;
  local_38 = 0x100000001;
  local_5c[2] = 1;
  auVar3 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bfvar = (Parameter)auVar3[0];
  *(long *)&this->field_0x119 = auVar3._1_8_;
  *(int7 *)&this->field_0x121 = auVar3._9_7_;
  this->global_fertility = true;
  return;
}

Assistant:

void AttentionalModel<Builder>::add_fertility_params(dynet::Model* model, unsigned hidden_dim, bool _rnn_src_embeddings)
{
    if (_rnn_src_embeddings) {
         p_Wfhid = model->add_parameters({hidden_dim, 2*hidden_dim});
     } else {
         p_Wfhid = model->add_parameters({hidden_dim, hidden_dim});
     }
     p_bfhid = model->add_parameters({hidden_dim});
     p_Wfmu = model->add_parameters({hidden_dim});
     p_bfmu = model->add_parameters({1});
     p_Wfvar = model->add_parameters({hidden_dim});
     p_bfvar = model->add_parameters({1});

     global_fertility = true;
}